

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values_prepare.c
# Opt level: O0

double * mpt_values_prepare(mpt_array *arr,long len)

{
  size_t sVar1;
  mpt_type_traits *pmVar2;
  int *piVar3;
  size_t __n;
  mpt_buffer *pmVar4;
  long used;
  size_t add;
  uint8_t *data;
  mpt_buffer *buf;
  mpt_type_traits *traits;
  long len_local;
  mpt_array *arr_local;
  
  pmVar2 = (mpt_type_traits *)mpt_type_traits(100);
  pmVar4 = arr->_buf;
  if (pmVar4 == (mpt_buffer *)0x0) {
    if (len < 0) {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      arr_local = (mpt_array *)0x0;
    }
    else {
      __n = len << 3;
      pmVar4 = (mpt_buffer *)_mpt_buffer_alloc(__n);
      if (pmVar4 == (mpt_buffer *)0x0) {
        arr_local = (mpt_array *)0x0;
      }
      else {
        arr->_buf = pmVar4;
        pmVar4->_used = __n;
        pmVar4->_content_traits = pmVar2;
        arr_local = (mpt_array *)(pmVar4 + 1);
        memset(arr_local,0,__n);
      }
    }
  }
  else if (pmVar2 == pmVar4->_content_traits) {
    sVar1 = pmVar4->_used;
    if (len < 0) {
      if ((long)sVar1 < -len) {
        piVar3 = __errno_location();
        *piVar3 = 0x16;
        return (double *)0x0;
      }
      used = len * -8;
    }
    else {
      used = len << 3;
    }
    pmVar4 = (*pmVar4->_vptr->detach)(pmVar4,sVar1 + used);
    if (pmVar4 == (mpt_buffer *)0x0) {
      arr_local = (mpt_array *)0x0;
    }
    else {
      arr->_buf = pmVar4;
      if (len < 0) {
        memcpy((void *)((long)&pmVar4[1]._vptr + sVar1),
               (void *)((long)pmVar4 + (sVar1 - used) + 0x20),used);
      }
      else {
        memset((void *)((long)&pmVar4[1]._vptr + sVar1),0,used);
      }
      add = (long)&pmVar4[1]._vptr + sVar1;
      pmVar4->_used = sVar1 + used;
      arr_local = (mpt_array *)add;
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x39;
    arr_local = (mpt_array *)0x0;
  }
  return (double *)arr_local;
}

Assistant:

extern double *mpt_values_prepare(_MPT_ARRAY_TYPE(double) *arr, long len)
{
	const MPT_STRUCT(type_traits) *traits = mpt_type_traits('d');
	MPT_STRUCT(buffer) *buf;
	uint8_t *data;
	size_t add;
	long used;
	
	if (!(buf = arr->_buf)) {
		if (len < 0) {
			errno = EINVAL;
			return 0;
		}
		add = len * sizeof(double);
		if (!(buf = _mpt_buffer_alloc(add, 0))) {
			return 0;
		}
		arr->_buf = buf;
		buf->_used = add;
		buf->_content_traits = traits;
		
		return memset(buf + 1, 0, add);
	}
	/* require typed buffer data */
	if (traits != buf->_content_traits) {
		errno = EBADSLT;
		return 0;
	}
	/* existing size and limit */
	used = buf->_used;
	if (len >= 0) {
		add = len * sizeof(double);
	}
	else if (used < (-len)) {
		errno = EINVAL;
		return 0;
	} else {
		add = (-len) * sizeof(double);
	}
	if (!(buf = buf->_vptr->detach(buf, used + add))) {
		return 0;
	}
	arr->_buf = buf;
	data = (void *) (buf + 1);
	if (len < 0) {
		data = memcpy(data + used, data + (used - add), add);
	} else {
		data = memset(data + used, 0, add);
	}
	buf->_used = used + add;
	return (double *) data;
}